

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

QStringList * __thiscall
QAbstractFileEngine::entryList(QAbstractFileEngine *this,Filters filters,QStringList *filterNames)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QStringList *ret;
  long lVar1;
  
  *in_RDI = 0xaaaaaaaaaaaaaaaa;
  in_RDI[1] = 0xaaaaaaaaaaaaaaaa;
  in_RDI[2] = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x191775);
  *in_RDI = 0xaaaaaaaaaaaaaaaa;
  in_RDI[1] = 0xaaaaaaaaaaaaaaaa;
  in_RDI[2] = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x1917c5);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<QAbstractFileEngine::FileFlag>::QFlags((QFlags<QAbstractFileEngine::FileFlag> *)0x191801);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringList *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAbstractFileEngine::entryList(QDir::Filters filters, const QStringList &filterNames) const
{
    QStringList ret;
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(filters);
    Q_UNUSED(filterNames);
    Q_UNREACHABLE_RETURN(ret);
#else
    for (const auto &dirEntry : QDirListing(fileName(), filterNames, filters.toInt()))
        ret.emplace_back(dirEntry.fileName());
    return ret;
#endif
}